

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorNull.cpp
# Opt level: O2

int __thiscall pele::physics::reactions::ReactorNull::init(ReactorNull *this,EVP_PKEY_CTX *ctx)

{
  ParmParse pp;
  allocator local_81;
  string local_80;
  ParmParse local_60;
  
  this->m_reactor_type = (int)ctx;
  ReactorTypes::check_reactor_type((int)ctx);
  std::__cxx11::string::string((string *)&local_80,"ode",&local_81);
  amrex::ParmParse::ParmParse(&local_60,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  amrex::ParmParse::query
            (&local_60,"verbose",
             &(this->super_Register<pele::physics::reactions::ReactorNull>).super_ReactorBase.
              verbose,0);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_60);
  return 0;
}

Assistant:

int
ReactorNull::init(int reactor_type, int /*ncells*/)
{
  BL_PROFILE("Pele::ReactorNull::init()");
  m_reactor_type = reactor_type;
  ReactorTypes::check_reactor_type(m_reactor_type);
  amrex::ParmParse pp("ode");
  pp.query("verbose", verbose);
  return (0);
}